

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O1

HRESULT __thiscall
BGParseWorkItem::DeserializeParseResults
          (BGParseWorkItem *this,ScriptContext *scriptContextUI,LPCUTF8 pszSrc,SRCINFO *pSrcInfo,
          Utf8SourceInfo *utf8SourceInfo,FunctionBody **functionBodyReturn,size_t *srcLength,
          uint *sourceIndex)

{
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  IRecyclerVisitedObject local_48;
  Type functionBody;
  Utf8SourceInfo *local_38;
  Utf8SourceInfo *utf8SourceInfo_local;
  
  iVar5 = this->parseHR;
  if (iVar5 == 0) {
    functionBody.ptr = (FunctionBody *)functionBodyReturn;
    local_38 = utf8SourceInfo;
    if (utf8SourceInfo == (Utf8SourceInfo *)0x0) {
      Js::ScriptContext::MakeUtf8SourceInfo
                (scriptContextUI,this->script,this->cb,pSrcInfo,&local_38,LoadScriptFlag_Utf8Source,
                 (Var)0x0);
    }
    sVar1 = this->parseSourceLength;
    *srcLength = sVar1;
    uVar4 = Js::ScriptContext::SaveSourceNoCopy(scriptContextUI,local_38,(int)sVar1,false);
    *sourceIndex = uVar4;
    if (uVar4 == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BGParseManager.cpp"
                         ,0x25b,"(sourceIndex != Js::Constants::InvalidSourceIndex)",
                         "sourceIndex != Js::Constants::InvalidSourceIndex");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    local_48._vptr_IRecyclerVisitedObject = (_func_int **)0x0;
    iVar5 = Js::ByteCodeSerializer::DeserializeFromBuffer
                      (scriptContextUI,0x1118,pszSrc,pSrcInfo,this->bufferReturn,(NativeModule *)0x0
                       ,(Type *)&local_48,*sourceIndex);
    if (iVar5 == 0) {
      ((functionBody.ptr)->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
           local_48._vptr_IRecyclerVisitedObject;
      this->bufferReturn = (byte *)0x0;
      this->bufferReturnBytes = 0;
    }
  }
  return iVar5;
}

Assistant:

HRESULT BGParseWorkItem::DeserializeParseResults(
    Js::ScriptContext* scriptContextUI,
    LPCUTF8 pszSrc,
    SRCINFO const * pSrcInfo,
    Js::Utf8SourceInfo* utf8SourceInfo,
    Js::FunctionBody** functionBodyReturn,
    size_t& srcLength,
    uint& sourceIndex
)
{
    HRESULT hr = this->parseHR;
    if (hr == S_OK)
    {
        if (utf8SourceInfo == nullptr)
        {
            scriptContextUI->MakeUtf8SourceInfo(
                this->script,
                this->cb,
                pSrcInfo,
                &utf8SourceInfo,
                LoadScriptFlag_Utf8Source,
                nullptr // Var scriptSource
            );
        }

        srcLength = this->parseSourceLength;
        sourceIndex = scriptContextUI->SaveSourceNoCopy(utf8SourceInfo, (int)srcLength, false /*isCesu8*/);
        Assert(sourceIndex != Js::Constants::InvalidSourceIndex);

        Field(Js::FunctionBody*) functionBody = nullptr;
        hr = Js::ByteCodeSerializer::DeserializeFromBuffer(
            scriptContextUI,
            BGPARSE_FLAGS,
            (const byte *)pszSrc,
            pSrcInfo,
            this->bufferReturn,
            nullptr, // nativeModule
            &functionBody,
            sourceIndex
        );

        if (hr == S_OK)
        {
            // The buffer is now owned by the output of DeserializeFromBuffer
            (*functionBodyReturn) = functionBody;
            this->bufferReturn = nullptr;
            this->bufferReturnBytes = 0;
        }
    }

    return hr;
}